

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_window.cpp
# Opt level: O0

Am_Object generate_search_group
                    (Am_Value_List *pos_slots,char *main_label,int *current_y,bool main_check_box,
                    Am_Value_List *slots_to_item,Am_Value_List *slots_values)

{
  Am_Value_List *this;
  bool bVar1;
  Am_Slot_Key AVar2;
  int iVar3;
  Am_Object *pAVar4;
  Am_Object *pAVar5;
  Am_Constraint *pAVar6;
  Am_Wrapper *pAVar7;
  Am_Value *pAVar8;
  ostream *poVar9;
  undefined7 in_register_00000009;
  int *piVar10;
  Am_Value_List *in_stack_00000008;
  Am_Object local_170;
  Am_Object local_168;
  Am_Value local_160;
  Am_Assoc local_150;
  Am_Object local_148;
  Am_Value local_140;
  Am_Value_List local_130;
  Am_Object local_120;
  Am_Am_Slot_Key local_112;
  undefined1 local_110 [8];
  Am_Value this_value;
  Am_Object local_f8;
  Am_Object local_f0;
  Am_Object local_e8;
  Am_Object local_e0;
  Am_Object local_d8;
  Am_Object local_d0;
  Am_Object local_c8;
  Am_Object local_c0;
  Am_Formula local_b8;
  Am_Formula local_a8;
  Am_Object local_98;
  Am_Object local_90;
  Am_Object local_88;
  undefined1 local_80 [8];
  Am_Value_List sub_parts;
  int this_y;
  int this_w;
  int max_item_width;
  Am_Object this_item;
  char *s;
  Am_Am_Slot_Key local_3c;
  byte local_39;
  Am_Am_Slot_Key this_slot;
  Am_Value_List *pAStack_38;
  Am_Value_List *slots_to_item_local;
  bool main_check_box_local;
  int *current_y_local;
  char *main_label_local;
  Am_Value_List *pos_slots_local;
  Am_Object *group;
  
  piVar10 = (int *)CONCAT71(in_register_00000009,main_check_box);
  local_39 = 0;
  pAStack_38 = slots_values;
  Am_Object::Am_Object((Am_Object *)pos_slots);
  Am_Am_Slot_Key::Am_Am_Slot_Key(&local_3c,0);
  Am_Object::Am_Object((Am_Object *)&this_w);
  sub_parts.item._4_4_ = 0;
  Am_Value_List::Am_Value_List((Am_Value_List *)local_80);
  Am_Object::Create(&local_88,(char *)&Am_Group);
  pAVar4 = Am_Object::Set(&local_88,100,5,0);
  pAVar4 = Am_Object::Set(pAVar4,0x65,*piVar10,0);
  pAVar4 = Am_Object::Set(pAVar4,0x66,0x1b8,0);
  Am_Object::Create(&local_98,(char *)&Am_Border_Rectangle);
  pAVar5 = Am_Object::Set(&local_98,100,0,0);
  pAVar5 = Am_Object::Set(pAVar5,0x65,0,0);
  Am_From_Owner((Am_Slot_Key)&local_a8);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_(&local_a8);
  pAVar5 = Am_Object::Set(pAVar5,0x66,pAVar6,0);
  Am_From_Owner((Am_Slot_Key)&local_b8);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_(&local_b8);
  pAVar5 = Am_Object::Set(pAVar5,0x67,pAVar6,0);
  pAVar5 = Am_Object::Set(pAVar5,0x172,0,0);
  pAVar7 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Default_Color);
  pAVar5 = Am_Object::Set(pAVar5,0x6a,pAVar7,0);
  Am_Object::Am_Object(&local_90,pAVar5);
  pAVar4 = Am_Object::Add_Part(pAVar4,&local_90,true,0);
  Am_Object::operator=((Am_Object *)pos_slots,pAVar4);
  Am_Object::~Am_Object(&local_90);
  Am_Formula::~Am_Formula(&local_b8);
  Am_Formula::~Am_Formula(&local_a8);
  Am_Object::~Am_Object(&local_98);
  Am_Object::~Am_Object(&local_88);
  AVar2 = Am_MAIN_BUTTON;
  if (((ulong)slots_to_item & 1) == 0) {
    Am_Object::Create((Am_Object *)&this_value.value,(char *)&Am_Text);
    pAVar4 = Am_Object::Set((Am_Object *)&this_value.value,100,10,0);
    pAVar4 = Am_Object::Set(pAVar4,0x65,10,0);
    pAVar4 = Am_Object::Set(pAVar4,0xab,(char *)current_y,0);
    pAVar7 = Am_Font::operator_cast_to_Am_Wrapper_(&search_bold_font);
    pAVar4 = Am_Object::Set(pAVar4,0xac,pAVar7,0);
    pAVar7 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Black);
    pAVar4 = Am_Object::Set(pAVar4,0x6b,pAVar7,0);
    pAVar7 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_No_Style);
    pAVar4 = Am_Object::Set(pAVar4,0x6a,pAVar7,0);
    Am_Object::Am_Object(&local_f8,pAVar4);
    Am_Object::Add_Part((Am_Object *)pos_slots,&local_f8,true,0);
    Am_Object::~Am_Object(&local_f8);
    Am_Object::~Am_Object((Am_Object *)&this_value.value);
    sub_parts.item._4_4_ = sub_parts.item._4_4_ + 0x14;
  }
  else {
    Am_Object::Create(&local_c8,(char *)&search_item_proto);
    pAVar4 = Am_Object::Set(&local_c8,100,10,0);
    pAVar4 = Am_Object::Set(pAVar4,0x65,5,0);
    pAVar4 = Am_Object::Set(pAVar4,0x150,(char *)current_y,0);
    pAVar4 = Am_Object::Set(pAVar4,0xcc,true,0);
    Am_Object::Am_Object(&local_c0,pAVar4);
    Am_Object::Add_Part((Am_Object *)pos_slots,AVar2,&local_c0,0);
    Am_Object::~Am_Object(&local_c0);
    Am_Object::~Am_Object(&local_c8);
    AVar2 = (Am_Slot_Key)pos_slots;
    Am_Object::Get_Object(&local_d8,AVar2,(ulong)Am_MAIN_BUTTON);
    Am_Object::Get_Object(&local_d0,(Am_Slot_Key)&local_d8,(ulong)Am_USE_ITEM);
    pAVar8 = Am_Object::Get(&local_d0,0x66,0);
    iVar3 = Am_Value::operator_cast_to_int(pAVar8);
    Am_Object::~Am_Object(&local_d0);
    Am_Object::~Am_Object(&local_d8);
    Am_Object::Get_Object(&local_e0,AVar2,(ulong)Am_MAIN_BUTTON);
    Am_Object::Set(&local_e0,0x11d,iVar3,0);
    Am_Object::~Am_Object(&local_e0);
    Am_Object::Get_Object(&local_f0,AVar2,(ulong)Am_MAIN_BUTTON);
    Am_Object::Get_Object(&local_e8,(Am_Slot_Key)&local_f0,(ulong)Am_USE_ITEM);
    pAVar7 = Am_Font::operator_cast_to_Am_Wrapper_(&search_bold_font);
    Am_Object::Set(&local_e8,0xac,pAVar7,0);
    Am_Object::~Am_Object(&local_e8);
    Am_Object::~Am_Object(&local_f0);
    sub_parts.item._4_4_ = sub_parts.item._4_4_ + 0x23;
  }
  this_y = 0;
  Am_Value::Am_Value((Am_Value *)local_110);
  Am_Value_List::Start((Am_Value_List *)main_label);
  while( true ) {
    bVar1 = Am_Value_List::Last((Am_Value_List *)main_label);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      Am_Value_List::Start((Am_Value_List *)local_80);
      while( true ) {
        bVar1 = Am_Value_List::Last((Am_Value_List *)local_80);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        pAVar8 = Am_Value_List::Get((Am_Value_List *)local_80);
        Am_Object::operator=((Am_Object *)&this_w,pAVar8);
        Am_Object::Set((Am_Object *)&this_w,0x11d,this_y + 2,0);
        Am_Value_List::Next((Am_Value_List *)local_80);
      }
      Am_Object::Set((Am_Object *)pos_slots,0x67,sub_parts.item._4_4_,0);
      *piVar10 = sub_parts.item._4_4_ + *piVar10;
      local_39 = 1;
      Am_Value::~Am_Value((Am_Value *)local_110);
      Am_Value_List::~Am_Value_List((Am_Value_List *)local_80);
      Am_Object::~Am_Object((Am_Object *)&this_w);
      if ((local_39 & 1) == 0) {
        Am_Object::~Am_Object((Am_Object *)pos_slots);
      }
      return (Am_Object)(Am_Object_Data *)pos_slots;
    }
    pAVar8 = Am_Value_List::Get((Am_Value_List *)main_label);
    Am_Am_Slot_Key::Am_Am_Slot_Key(&local_112,pAVar8);
    local_3c.value = local_112.value;
    AVar2 = Am_Am_Slot_Key::operator_cast_to_unsigned_short(&local_3c);
    this_item.data = (Am_Object_Data *)Am_Get_Slot_Name(AVar2);
    Am_Object::Create(&local_120,(char *)&search_item_proto);
    pAVar4 = Am_Object::Set(&local_120,100,0x1e,0);
    pAVar4 = Am_Object::Set(pAVar4,0x65,sub_parts.item._4_4_,0);
    pAVar4 = Am_Object::Set(pAVar4,0x150,(char *)this_item.data,0);
    Am_Object::operator=((Am_Object *)&this_w,pAVar4);
    Am_Object::~Am_Object(&local_120);
    Am_Am_Slot_Key::operator_cast_to_Am_Value((Am_Am_Slot_Key *)&local_140);
    Am_Value_List::Assoc_2(&local_130,(Am_Value *)in_stack_00000008);
    Am_Value::operator=((Am_Value *)local_110,(Am_Value *)&local_130);
    Am_Value::~Am_Value((Am_Value *)&local_130);
    Am_Value::~Am_Value(&local_140);
    bVar1 = Am_Value::Exists((Am_Value *)local_110);
    if (!bVar1) break;
    Am_Object::Get_Object(&local_148,(Am_Slot_Key)&this_w,(ulong)Am_ITEM_VALUE);
    Am_Object::Set(&local_148,0xfa,(Am_Value *)local_110,0);
    Am_Object::~Am_Object(&local_148);
    this = pAStack_38;
    Am_Am_Slot_Key::operator_cast_to_Am_Value((Am_Am_Slot_Key *)&local_160);
    pAVar7 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&this_w);
    Am_Assoc::Am_Assoc(&local_150,&local_160,pAVar7);
    pAVar7 = Am_Assoc::operator_cast_to_Am_Wrapper_(&local_150);
    Am_Value_List::Add(this,pAVar7,Am_TAIL,true);
    Am_Assoc::~Am_Assoc(&local_150);
    Am_Value::~Am_Value(&local_160);
    pAVar7 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&this_w);
    Am_Value_List::Add((Am_Value_List *)local_80,pAVar7,Am_TAIL,true);
    sub_parts.item._4_4_ = sub_parts.item._4_4_ + 0x1e;
    Am_Object::Get_Object(&local_168,(Am_Slot_Key)&this_w,(ulong)Am_USE_ITEM);
    pAVar8 = Am_Object::Get(&local_168,0x66,0);
    iVar3 = Am_Value::operator_cast_to_int(pAVar8);
    Am_Object::~Am_Object(&local_168);
    if (this_y < iVar3) {
      this_y = iVar3;
    }
    Am_Object::Am_Object(&local_170,(Am_Object *)&this_w);
    Am_Object::Add_Part((Am_Object *)pos_slots,&local_170,true,0);
    Am_Object::~Am_Object(&local_170);
    Am_Value_List::Next((Am_Value_List *)main_label);
  }
  poVar9 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
  poVar9 = std::operator<<(poVar9,"Lost value for key ");
  poVar9 = operator<<(poVar9,&local_3c);
  poVar9 = std::operator<<(poVar9," from ");
  poVar9 = operator<<(poVar9,in_stack_00000008);
  std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  Am_Error();
}

Assistant:

Am_Object
generate_search_group(Am_Value_List &pos_slots, const char *main_label,
                      int &current_y, bool main_check_box,
                      Am_Value_List &slots_to_item, Am_Value_List &slots_values)
{
  Am_Object group;
  Am_Am_Slot_Key this_slot;
  const char *s;
  Am_Object this_item;
  int max_item_width = 0;
  int this_w;
  int this_y = 0;
  Am_Value_List sub_parts;
  group = Am_Group.Create()
              .Set(Am_LEFT, 5)
              .Set(Am_TOP, current_y)
              .Set(Am_WIDTH, WINDOW_WIDTH - 10)
              .Add_Part(Am_Border_Rectangle.Create()
                            .Set(Am_LEFT, 0)
                            .Set(Am_TOP, 0)
                            .Set(Am_WIDTH, Am_From_Owner(Am_WIDTH))
                            .Set(Am_HEIGHT, Am_From_Owner(Am_HEIGHT))
                            .Set(Am_SELECTED, 0)
                            .Set(Am_FILL_STYLE, Am_Default_Color));

  if (main_check_box) {
    group.Add_Part(Am_MAIN_BUTTON, search_item_proto.Create()
                                       .Set(Am_LEFT, 10)
                                       .Set(Am_TOP, 5)
                                       .Set(Am_LABEL, main_label)
                                       .Set(Am_ACTIVE, true));
    max_item_width =
        group.Get_Object(Am_MAIN_BUTTON).Get_Object(Am_USE_ITEM).Get(Am_WIDTH);
    group.Get_Object(Am_MAIN_BUTTON).Set(Am_X_OFFSET, max_item_width);
    group.Get_Object(Am_MAIN_BUTTON)
        .Get_Object(Am_USE_ITEM)
        .Set(Am_FONT, search_bold_font);
    this_y += ITEM_SIZE + 5;
  } else {
    group.Add_Part(Am_Text.Create()
                       .Set(Am_LEFT, 2 * OFFSET)
                       .Set(Am_TOP, 2 * OFFSET)
                       .Set(Am_TEXT, main_label)
                       .Set(Am_FONT, search_bold_font)
                       .Set(Am_LINE_STYLE, Am_Black)
                       .Set(Am_FILL_STYLE, Am_No_Style));
    this_y += 20;
  }
  max_item_width = 0;
  Am_Value this_value;
  for (pos_slots.Start(); !pos_slots.Last(); pos_slots.Next()) {
    this_slot = Am_Am_Slot_Key(pos_slots.Get());
    s = Am_Get_Slot_Name(this_slot);
    this_item = search_item_proto.Create()
                    .Set(Am_LEFT, INDENT_OFFSET)
                    .Set(Am_TOP, this_y)
                    .Set(Am_LABEL, s);
    this_value = slots_values.Assoc_2(this_slot);
    if (!this_value.Exists())
      Am_ERROR("Lost value for key " << this_slot << " from " << slots_values);
    this_item.Get_Object(Am_ITEM_VALUE).Set(Am_VALUES, this_value);
    slots_to_item.Add(Am_Assoc(this_slot, this_item));
    sub_parts.Add(this_item);
    this_y += ITEM_SIZE;
    this_w = this_item.Get_Object(Am_USE_ITEM).Get(Am_WIDTH);
    if (this_w > max_item_width)
      max_item_width = this_w;
    group.Add_Part(this_item);
  }
  for (sub_parts.Start(); !sub_parts.Last(); sub_parts.Next()) {
    this_item = sub_parts.Get();
    this_item.Set(Am_X_OFFSET, max_item_width + 2);
  }
  group.Set(Am_HEIGHT, this_y);
  current_y += this_y;
  return group;
}